

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<QFileDialogPrivate::HistoryItem*,long_long>
               (HistoryItem *first,longlong n,HistoryItem *d_first)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QPersistentModelIndex *pQVar5;
  QArrayDataPointer<QPersistentModelIndex> *this;
  HistoryItem *pHVar6;
  HistoryItem *pHVar7;
  HistoryItem *pHVar8;
  long in_FS_OFFSET;
  Destructor local_48;
  HistoryItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  pHVar8 = d_first + n;
  pHVar7 = first;
  pHVar6 = pHVar8;
  if (first < pHVar8) {
    pHVar7 = pHVar8;
    pHVar6 = first;
  }
  local_30 = d_first;
  if (d_first != pHVar6) {
    do {
      pDVar1 = (first->path).d.d;
      (first->path).d.d = (Data *)0x0;
      (local_30->path).d.d = pDVar1;
      pcVar2 = (first->path).d.ptr;
      (first->path).d.ptr = (char16_t *)0x0;
      (local_30->path).d.ptr = pcVar2;
      qVar3 = (first->path).d.size;
      (first->path).d.size = 0;
      (local_30->path).d.size = qVar3;
      pDVar4 = (first->selection).d.d;
      (first->selection).d.d = (Data *)0x0;
      (local_30->selection).d.d = pDVar4;
      pQVar5 = (first->selection).d.ptr;
      (first->selection).d.ptr = (QPersistentModelIndex *)0x0;
      (local_30->selection).d.ptr = pQVar5;
      qVar3 = (first->selection).d.size;
      (first->selection).d.size = 0;
      (local_30->selection).d.size = qVar3;
      local_30 = local_30 + 1;
      first = first + 1;
    } while (local_30 != pHVar6);
  }
  local_48.intermediate = local_30;
  local_48.end = d_first;
  for (; local_30 != pHVar8; local_30 = local_30 + 1) {
    pDVar1 = (local_30->path).d.d;
    (local_30->path).d.d = (first->path).d.d;
    (first->path).d.d = pDVar1;
    pcVar2 = (local_30->path).d.ptr;
    (local_30->path).d.ptr = (first->path).d.ptr;
    (first->path).d.ptr = pcVar2;
    qVar3 = (local_30->path).d.size;
    (local_30->path).d.size = (first->path).d.size;
    (first->path).d.size = qVar3;
    QArrayDataPointer<QPersistentModelIndex>::operator=
              (&(local_30->selection).d,&(first->selection).d);
    first = first + 1;
  }
  local_48.iter = &local_48.end;
  if (first != pHVar7) {
    this = &first[-1].selection.d;
    do {
      QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(this);
      pDVar4 = this[-1].d;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(this[-1].d)->super_QArrayData,2,0x10);
        }
      }
      pHVar6 = (HistoryItem *)(this + -1);
      this = this + -2;
    } while (pHVar6 != pHVar7);
  }
  q_relocate_overlap_n_left_move<QFileDialogPrivate::HistoryItem_*,_long_long>::Destructor::
  ~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}